

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_helpers.hpp
# Opt level: O3

void ear::
     mask_write<ear::OutputGains&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (OutputGains *out,
               CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
               *mask,Matrix<double,__1,_1,_0,__1,_1> *values)

{
  double *pdVar1;
  int iVar2;
  int extraout_var;
  internal_error *piVar4;
  char *__function;
  long lVar5;
  long lVar6;
  string local_58;
  Index local_38;
  long lVar3;
  
  iVar2 = (*out->_vptr_OutputGains[1])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != (mask->m_xpr->super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows) {
    piVar4 = (internal_error *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"in mask_write: out_size and mask_write must be the same length",
               "");
    internal_error::internal_error(piVar4,&local_58);
    __cxa_throw(piVar4,&internal_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38 = (values->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
  if (lVar3 == 0 || extraout_var < 0) {
    lVar5 = 0;
  }
  else {
    lVar6 = 0;
    lVar5 = 0;
    do {
      if ((mask->m_xpr->super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows <= lVar6) {
        __function = 
        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>, const Eigen::Array<bool, -1, 1>>, 0>::operator[](Index) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>, const Eigen::Array<bool, -1, 1>>, Level = 0]"
        ;
LAB_00165fbe:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xa3,__function);
      }
      if ((mask->m_xpr->super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>).m_storage.
          m_data[lVar6] == false) {
        if ((lVar5 < 0) ||
           ((values->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows <= lVar5)) {
          __function = 
          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
          ;
          goto LAB_00165fbe;
        }
        pdVar1 = (values->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + lVar5;
        lVar5 = lVar5 + 1;
        (*out->_vptr_OutputGains[2])(*pdVar1,out,lVar6);
      }
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  if (lVar5 != local_38) {
    piVar4 = (internal_error *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "in mask_size: length of values must equal the number of entries in mask","");
    internal_error::internal_error(piVar4,&local_58);
    __cxa_throw(piVar4,&internal_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void mask_write(OutT &&out, const MaskT &mask, const ValuesT &values) {
    Eigen::Index out_size = out.size();
    Eigen::Index mask_size = mask.size();
    Eigen::Index values_size = values.size();

    ear_assert(
        out_size == mask_size,
        "in mask_write: out_size and mask_write must be the same length");

    Eigen::Index j = 0;
    for (Eigen::Index i = 0; i < mask_size; i++)
      if (mask[i]) vec_write(out, i, values[j++]);

    ear_assert(j == values_size,
               "in mask_size: length of values must equal the number of "
               "entries in mask");
  }